

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

String * kj::heapString(String *__return_storage_ptr__,char *value,size_t size)

{
  char *value_00;
  char *buffer;
  size_t size_local;
  char *value_local;
  
  value_00 = _::HeapArrayDisposer::allocate<char>(size + 1);
  if (size != 0) {
    memcpy(value_00,value,size);
  }
  value_00[size] = '\0';
  String::String(__return_storage_ptr__,value_00,size,
                 (ArrayDisposer *)&_::HeapArrayDisposer::instance);
  return __return_storage_ptr__;
}

Assistant:

String heapString(const char* value, size_t size) {
  char* buffer = _::HeapArrayDisposer::allocate<char>(size + 1);
  if (size != 0u) {
    memcpy(buffer, value, size);
  }
  buffer[size] = '\0';
  return String(buffer, size, _::HeapArrayDisposer::instance);
}